

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall
branch_and_reduce_algorithm::compute_alternative
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *A,
          vector<int,_std::allocator<int>_> *B)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  vector<int,_std::allocator<int>_> *this_00;
  iterator iVar6;
  iterator __last;
  const_reference pvVar7;
  reference pvVar8;
  ulong uVar9;
  reference piVar10;
  uint *puVar11;
  reference pvVar12;
  reference piVar13;
  reference this_01;
  vector<int,_std::allocator<int>_> *local_510;
  uint local_4f4;
  iterator iStack_418;
  int n_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  iterator iStack_3f8;
  int v_2;
  iterator __end2_6;
  iterator __begin2_6;
  vector<int,_std::allocator<int>_> *__range2_6;
  iterator iStack_3d8;
  int n;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  iterator iStack_3b8;
  int v_1;
  iterator __end2_5;
  iterator __begin2_5;
  vector<int,_std::allocator<int>_> *__range2_5;
  undefined1 local_338 [24];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_320;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_318;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_310;
  undefined1 local_308 [8];
  vector<int,_std::allocator<int>_> copyOfTmp;
  iterator iStack_2e8;
  int u_4;
  iterator __end2_4;
  iterator __begin2_4;
  value_type *__range2_4;
  vector<int,_std::allocator<int>_> *C;
  uint local_2c0;
  uint v;
  uint i_4;
  int b_3;
  const_iterator __end1_7;
  const_iterator __begin1_7;
  vector<int,_std::allocator<int>_> *__range1_7;
  const_iterator cStack_298;
  int a_3;
  const_iterator __end1_6;
  const_iterator __begin1_6;
  vector<int,_std::allocator<int>_> *__range1_6;
  undefined1 local_278 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newAdj;
  uint local_258;
  uint i_3;
  uint i_2;
  vector<int,_std::allocator<int>_> vs;
  uint local_230;
  uint i_1;
  uint i;
  vector<int,_std::allocator<int>_> removed;
  allocator<int> local_1f9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e8;
  undefined1 local_1e0 [8];
  vector<int,_std::allocator<int>_> B2;
  iterator iStack_1c0;
  int u_3;
  iterator __end2_3;
  iterator __begin2_3;
  value_type *__range2_3;
  const_iterator cStack_1a0;
  int b_2;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  vector<int,_std::allocator<int>_> *__range1_5;
  const_iterator cStack_180;
  int a_2;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  vector<int,_std::allocator<int>_> *__range1_4;
  allocator<int> local_141;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_140;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_138;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_130;
  undefined1 local_128 [8];
  vector<int,_std::allocator<int>_> A2;
  iterator iStack_108;
  int u_2;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  const_iterator cStack_e8;
  int a_1;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  const_iterator cStack_c8;
  int b_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  vector<int,_std::allocator<int>_> *tmp;
  int local_a0;
  NodeID q;
  NodeID p;
  int u_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  const_iterator cStack_78;
  int a;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  iterator iStack_58;
  int u;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  const_iterator cStack_38;
  int b;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *B_local;
  vector<int,_std::allocator<int>_> *A_local;
  branch_and_reduce_algorithm *this_local;
  
  sVar4 = std::vector<int,_std::allocator<int>_>::size(A);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(B);
  if (sVar4 == sVar5) {
    fast_set::clear(&this->used);
    __end1 = std::vector<int,_std::allocator<int>_>::begin(B);
    cStack_38 = std::vector<int,_std::allocator<int>_>::end(B);
    while (bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1);
      pvVar12 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->adj,(long)*piVar10);
      __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar12);
      iStack_58 = std::vector<int,_std::allocator<int>_>::end(pvVar12);
      while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffa8), bVar3) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2);
        iVar2 = *piVar13;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
        if (*pvVar8 < 0) {
          fast_set::add(&this->used,iVar2);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1);
    }
    __end1_1 = std::vector<int,_std::allocator<int>_>::begin(A);
    cStack_78 = std::vector<int,_std::allocator<int>_>::end(A);
    while (bVar3 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff88), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_1);
      pvVar12 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->adj,(long)*piVar10);
      __end2_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar12);
      _p = std::vector<int,_std::allocator<int>_>::end(pvVar12);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&p), bVar3) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2_1);
        iVar2 = *piVar13;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
        if ((*pvVar8 < 0) && (bVar3 = fast_set::get(&this->used,iVar2), bVar3)) {
          set(this,iVar2,1);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_1);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_1);
    }
    local_a0 = 0;
    this_00 = &this->modTmp;
    fast_set::clear(&this->used);
    __end1_2 = std::vector<int,_std::allocator<int>_>::begin(B);
    cStack_c8 = std::vector<int,_std::allocator<int>_>::end(B);
    while (bVar3 = __gnu_cxx::operator!=(&__end1_2,&stack0xffffffffffffff38), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_2);
      fast_set::add(&this->used,*piVar10);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_2);
    }
    __end1_3 = std::vector<int,_std::allocator<int>_>::begin(A);
    cStack_e8 = std::vector<int,_std::allocator<int>_>::end(A);
    while (bVar3 = __gnu_cxx::operator!=(&__end1_3,&stack0xffffffffffffff18), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_3);
      pvVar12 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->adj,(long)*piVar10);
      __end2_2 = std::vector<int,_std::allocator<int>_>::begin(pvVar12);
      iStack_108 = std::vector<int,_std::allocator<int>_>::end(pvVar12);
      while (bVar3 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffef8), bVar3) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2_2);
        A2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = *piVar13;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->x,(long)A2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
        if ((*pvVar8 < 0) &&
           (bVar3 = fast_set::add(&this->used,
                                  A2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_),
           vVar1 = A2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage._4_4_, bVar3)) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_a0);
          *pvVar8 = vVar1;
          local_a0 = local_a0 + 1;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_2);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_3);
    }
    local_130._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
    local_140._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
    local_138 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&local_140,(long)local_a0);
    std::allocator<int>::allocator(&local_141);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)local_128,local_130,local_138,&local_141);
    std::allocator<int>::~allocator(&local_141);
    iVar6 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_128);
    __last = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_128);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current)
    ;
    local_a0 = 0;
    fast_set::clear(&this->used);
    __end1_4 = std::vector<int,_std::allocator<int>_>::begin(A);
    cStack_180 = std::vector<int,_std::allocator<int>_>::end(A);
    while (bVar3 = __gnu_cxx::operator!=(&__end1_4,&stack0xfffffffffffffe80), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_4);
      fast_set::add(&this->used,*piVar10);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_4);
    }
    __end1_5 = std::vector<int,_std::allocator<int>_>::begin(B);
    cStack_1a0 = std::vector<int,_std::allocator<int>_>::end(B);
    while (bVar3 = __gnu_cxx::operator!=(&__end1_5,&stack0xfffffffffffffe60), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_5);
      pvVar12 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->adj,(long)*piVar10);
      __end2_3 = std::vector<int,_std::allocator<int>_>::begin(pvVar12);
      iStack_1c0 = std::vector<int,_std::allocator<int>_>::end(pvVar12);
      while (bVar3 = __gnu_cxx::operator!=(&__end2_3,&stack0xfffffffffffffe40), bVar3) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2_3);
        B2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = *piVar13;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->x,(long)B2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
        if ((*pvVar8 < 0) &&
           (bVar3 = fast_set::add(&this->used,
                                  B2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_),
           vVar1 = B2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage._4_4_, bVar3)) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_a0);
          *pvVar8 = vVar1;
          local_a0 = local_a0 + 1;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_3);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_5);
    }
    local_1e8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
    local_1f8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
    local_1f0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&local_1f8,(long)local_a0);
    std::allocator<int>::allocator(&local_1f9);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)local_1e0,local_1e8,local_1f0,&local_1f9);
    std::allocator<int>::~allocator(&local_1f9);
    iVar6 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_1e0);
    removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_1e0);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(A);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(B);
    std::allocator<int>::allocator((allocator<int> *)((long)&i_1 + 3));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&i,sVar4 + sVar5,
               (allocator<int> *)((long)&i_1 + 3));
    std::allocator<int>::~allocator((allocator<int> *)((long)&i_1 + 3));
    for (local_230 = 0; sVar4 = std::vector<int,_std::allocator<int>_>::size(A), local_230 < sVar4;
        local_230 = local_230 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](A,(ulong)local_230);
      vVar1 = *pvVar7;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i,(ulong)local_230);
      *pvVar8 = vVar1;
    }
    for (vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        uVar9 = (ulong)vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar4 = std::vector<int,_std::allocator<int>_>::size(B), uVar9 < sVar4;
        vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (B,(ulong)vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_);
      vVar1 = *pvVar7;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(A);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i,
                          sVar4 + vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar8 = vVar1;
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_128);
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_1e0);
    std::allocator<int>::allocator((allocator<int> *)((long)&i_3 + 3));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&i_2,sVar4 + sVar5,
               (allocator<int> *)((long)&i_3 + 3));
    std::allocator<int>::~allocator((allocator<int> *)((long)&i_3 + 3));
    for (local_258 = 0;
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_128), local_258 < sVar4;
        local_258 = local_258 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_128,(ulong)local_258);
      vVar1 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_2,(ulong)local_258);
      *pvVar8 = vVar1;
    }
    for (newAdj.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uVar9 = (ulong)newAdj.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_1e0), uVar9 < sVar4;
        newAdj.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             newAdj.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_1e0,
                          (ulong)newAdj.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      vVar1 = *pvVar8;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_128);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_2,
                          sVar4 + newAdj.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar8 = vVar1;
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i_2);
    std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&__range1_6 + 7));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_278,sVar4,
             (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&__range1_6 + 7));
    std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&__range1_6 + 7));
    fast_set::clear(&this->used);
    __end1_6 = std::vector<int,_std::allocator<int>_>::begin(A);
    cStack_298 = std::vector<int,_std::allocator<int>_>::end(A);
    while (bVar3 = __gnu_cxx::operator!=(&__end1_6,&stack0xfffffffffffffd68), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_6);
      fast_set::add(&this->used,*piVar10);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_6);
    }
    __end1_7 = std::vector<int,_std::allocator<int>_>::begin(B);
    _i_4 = std::vector<int,_std::allocator<int>_>::end(B);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_7,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)&i_4), bVar3) {
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_7);
      fast_set::add(&this->used,*piVar10);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_7);
    }
    for (local_2c0 = 0;
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&i_2), local_2c0 < sVar4;
        local_2c0 = local_2c0 + 1) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_128);
      if (local_2c0 < sVar4) {
        puVar11 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_128,(ulong)local_2c0
                                    );
        local_4f4 = *puVar11;
      }
      else {
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_128);
        puVar11 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_1e0,
                                     local_2c0 - sVar4);
        local_4f4 = *puVar11;
      }
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_128);
      if (local_2c0 < sVar4) {
        local_510 = (vector<int,_std::allocator<int>_> *)local_1e0;
      }
      else {
        local_510 = (vector<int,_std::allocator<int>_> *)local_128;
      }
      tmp._4_4_ = 0;
      local_a0 = 0;
      pvVar12 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->adj,(ulong)local_4f4);
      __end2_4 = std::vector<int,_std::allocator<int>_>::begin(pvVar12);
      iStack_2e8 = std::vector<int,_std::allocator<int>_>::end(pvVar12);
      while (bVar3 = __gnu_cxx::operator!=(&__end2_4,&stack0xfffffffffffffd18), bVar3) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2_4);
        copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = *piVar13;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->x,(long)copyOfTmp.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if ((*pvVar8 < 0) &&
           (bVar3 = fast_set::get(&this->used,
                                  copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_), !bVar3)) {
          while( true ) {
            sVar4 = std::vector<int,_std::allocator<int>_>::size(local_510);
            bVar3 = false;
            if ((ulong)(long)tmp._4_4_ < sVar4) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_510,(long)tmp._4_4_)
              ;
              bVar3 = *pvVar7 <=
                      copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
            }
            if (!bVar3) break;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_510,(long)tmp._4_4_);
            bVar3 = fast_set::get(&this->used,*pvVar7);
            if (!bVar3) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_510,(long)tmp._4_4_)
              ;
              vVar1 = *pvVar7;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_a0);
              *pvVar8 = vVar1;
              local_a0 = local_a0 + 1;
            }
            tmp._4_4_ = tmp._4_4_ + 1;
          }
          if ((local_a0 == 0) ||
             (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (this_00,(long)(local_a0 + -1)),
             *pvVar8 !=
             copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage._4_4_)) {
            vVar1 = copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_a0);
            *pvVar8 = vVar1;
            local_a0 = local_a0 + 1;
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_4);
      }
      for (; sVar4 = std::vector<int,_std::allocator<int>_>::size(local_510),
          (ulong)(long)tmp._4_4_ < sVar4; tmp._4_4_ = tmp._4_4_ + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_510,(long)tmp._4_4_);
        bVar3 = fast_set::get(&this->used,*pvVar7);
        if (!bVar3) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_510,(long)tmp._4_4_);
          vVar1 = *pvVar7;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_a0);
          *pvVar8 = vVar1;
          local_a0 = local_a0 + 1;
        }
      }
      local_310._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
      local_320._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
      local_318 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&local_320,(long)local_a0);
      std::allocator<int>::allocator((allocator<int> *)(local_338 + 0x17));
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_308,local_310,local_318,
                 (allocator<int> *)(local_338 + 0x17));
      std::allocator<int>::~allocator((allocator<int> *)(local_338 + 0x17));
      pvVar12 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_278,(ulong)local_2c0);
      std::vector<int,_std::allocator<int>_>::swap
                (pvVar12,(vector<int,_std::allocator<int>_> *)local_308);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_308);
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i);
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_128);
    alternative::alternative
              ((alternative *)&__range2_5,(int)(sVar4 >> 1),(vector<int,_std::allocator<int>_> *)&i,
               (vector<int,_std::allocator<int>_> *)&i_2,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_278,this,(int)sVar5);
    std::make_shared<alternative,alternative>((alternative *)local_338);
    iVar2 = this->modifiedN;
    this->modifiedN = iVar2 + 1;
    this_01 = std::vector<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>::
              operator[](&this->modifieds,(long)iVar2);
    std::shared_ptr<modified>::operator=(this_01,(shared_ptr<alternative> *)local_338);
    std::shared_ptr<alternative>::~shared_ptr((shared_ptr<alternative> *)local_338);
    alternative::~alternative((alternative *)&__range2_5);
    if ((USE_DEPENDENCY_CHECKING & 1U) != 0) {
      __end2_5 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&i);
      iStack_3b8 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)&i);
      while (bVar3 = __gnu_cxx::operator!=(&__end2_5,&stack0xfffffffffffffc48), bVar3) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2_5);
        pvVar12 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->adj,(long)*piVar13);
        __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar12);
        iStack_3d8 = std::vector<int,_std::allocator<int>_>::end(pvVar12);
        while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffc28), bVar3) {
          piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end3);
          ArraySet::Insert(&this->dc_candidates,*piVar13);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_5);
      }
      __end2_6 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&i_2);
      iStack_3f8 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)&i_2);
      while (bVar3 = __gnu_cxx::operator!=(&__end2_6,&stack0xfffffffffffffc08), bVar3) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2_6);
        iVar2 = *piVar13;
        ArraySet::Insert(&this->dc_candidates,iVar2);
        pvVar12 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->adj,(long)iVar2);
        __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar12);
        iStack_418 = std::vector<int,_std::allocator<int>_>::end(pvVar12);
        while (bVar3 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffbe8), bVar3) {
          piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end3_1);
          ArraySet::Insert(&this->dc_candidates,*piVar13);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3_1);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_6);
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_278);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_2);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1e0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_128);
    return;
  }
  __assert_fail("A.size() == B.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                ,0x126,
                "void branch_and_reduce_algorithm::compute_alternative(const std::vector<int> &, const std::vector<int> &)"
               );
}

Assistant:

void branch_and_reduce_algorithm::compute_alternative(std::vector<int> const &A, std::vector<int> const &B)
{
    assert(A.size() == B.size());
    used.clear();
    for (int b : B)
        for (int u : adj[b])
            if (x[u] < 0)
                used.add(u);

    for (int a : A)
        for (int u : adj[a])
            if (x[u] < 0 && used.get(u))
                set(u, 1);
    // sets v in N(A) and N(B) to 1

    NodeID p = 0, q = 0;
    std::vector<int> &tmp = modTmp;
    used.clear();
    for (int b : B)
        used.add(b);

    for (int a : A)
        for (int u : adj[a])
            if (x[u] < 0 && used.add(u))
                tmp[p++] = u;

    std::vector<int> A2(tmp.begin(), tmp.begin() + p);
    std::sort(A2.begin(), A2.end());
    // A2 contains v in N(A)\(B and N(B))
    p = 0;
    used.clear();
    for (int a : A)
        used.add(a);
    for (int b : B)
        for (int u : adj[b])
            if (x[u] < 0 && used.add(u))
                tmp[p++] = u;

    std::vector<int> B2(tmp.begin(), tmp.begin() + p);
    std::sort(B2.begin(), B2.end());
    // B2 contains v in N(B)\(A and N(A))

    std::vector<int> removed(A.size() + B.size());
    for (unsigned int i = 0; i < A.size(); i++)
        removed[i] = A[i];
    for (unsigned int i = 0; i < B.size(); i++)
        removed[A.size() + i] = B[i];
    std::vector<int> vs(A2.size() + B2.size());
    for (unsigned int i = 0; i < A2.size(); i++)
        vs[i] = A2[i];
    for (unsigned int i = 0; i < B2.size(); i++)
        vs[A2.size() + i] = B2[i];
    std::vector<std::vector<int>> newAdj(vs.size());
    used.clear();
    for (int a : A)
        used.add(a);
    for (int b : B)
        used.add(b);
    for (unsigned int i = 0; i < vs.size(); i++)
    {
        unsigned int v = (i < A2.size()) ? A2[i] : B2[i - A2.size()];
        std::vector<int> const &C = (i < A2.size()) ? B2 : A2;
        p = q = 0;
        for (int u : adj[v])
            if (x[u] < 0 && !used.get(u))
            {
                while (q < C.size() && C[q] <= u)
                {
                    if (used.get(C[q]))
                        q++;
                    else
                        tmp[p++] = C[q++];
                }
                if (p == 0 || tmp[p - 1] != u)
                    tmp[p++] = u;
            }
        while (q < C.size())
        {
            if (used.get(C[q]))
                q++;
            else
                tmp[p++] = C[q++];
        }
        {
            std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
            newAdj[i].swap(copyOfTmp);
        }
    }

    modifieds[modifiedN++] = make_shared<alternative>(alternative(removed.size() / 2, removed, vs, newAdj, this, A2.size()));

    if (USE_DEPENDENCY_CHECKING) {
        for (int v : removed) {
            for (int n : adj[v]) {
                dc_candidates.Insert(n);
            }
        }

        for (int v : vs) {
            dc_candidates.Insert(v);
            for (int n : adj[v]) {
                dc_candidates.Insert(n);
            }
        }
    }
}